

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O1

GCcdata * lj_cdata_newref(CTState *cts,void *p,CTypeID id)

{
  long *plVar1;
  CTypeID CVar2;
  GCcdata *pGVar3;
  
  CVar2 = lj_ctype_intern(cts,id + 0x22830000,8);
  pGVar3 = (GCcdata *)lj_mem_newgco(cts->L,0x10);
  pGVar3->gct = '\n';
  pGVar3->ctypeid = (uint16_t)CVar2;
  plVar1 = (long *)((ulong)(cts->L->glref).ptr32 + 0xe0);
  *plVar1 = *plVar1 + 1;
  pGVar3[1] = (GCcdata)p;
  return pGVar3;
}

Assistant:

GCcdata *lj_cdata_newref(CTState *cts, const void *p, CTypeID id)
{
  CTypeID refid = lj_ctype_intern(cts, CTINFO_REF(id), CTSIZE_PTR);
  GCcdata *cd = lj_cdata_new(cts, refid, CTSIZE_PTR);
  *(const void **)cdataptr(cd) = p;
  return cd;
}